

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

int sf::Texture::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  int extraout_EAX;
  undefined4 in_register_0000003c;
  long lVar1;
  float fVar2;
  TransientContextLock lock;
  GLfloat matrix [16];
  TransientContextLock local_59;
  ulong local_58 [3];
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  undefined8 uStack_20;
  
  lVar1 = CONCAT44(in_register_0000003c,__fd);
  GlResource::TransientContextLock::TransientContextLock(&local_59);
  if ((lVar1 == 0) || (*(int *)(lVar1 + 0x10) == 0)) {
    glBindTexture(0xde1,0);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x30e,"glBindTexture(GL_TEXTURE_2D, 0)");
    glMatrixMode(0x1702);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x311,"glMatrixMode(GL_TEXTURE)");
    glLoadIdentity();
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x312,"glLoadIdentity()");
    glMatrixMode(0x1700);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x315,"glMatrixMode(GL_MODELVIEW)");
  }
  else {
    glBindTexture(0xde1);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x2ea,"glBindTexture(GL_TEXTURE_2D, texture->m_texture)");
    if (((int)__addr == 1) || (*(char *)(lVar1 + 0x17) == '\x01')) {
      local_58[1] = 0;
      uStack_40 = 0;
      local_38 = 0;
      local_28 = 0;
      local_58[0] = 0x3f800000;
      fVar2 = 1.0;
      uStack_30 = 0x3f800000;
      uStack_20 = 0x3f80000000000000;
      if ((int)__addr == 1) {
        local_58[0] = (ulong)(uint)(1.0 / (float)*(uint *)(lVar1 + 8));
        fVar2 = 1.0 / (float)*(uint *)(lVar1 + 0xc);
      }
      local_58[2] = (ulong)(uint)fVar2 << 0x20;
      if (*(char *)(lVar1 + 0x17) == '\x01') {
        local_58[2] = (ulong)(uint)fVar2 << 0x20 ^ 0x8000000000000000;
        local_28 = (ulong)(uint)((float)*(uint *)(lVar1 + 4) / (float)*(uint *)(lVar1 + 0xc)) <<
                   0x20;
      }
      glMatrixMode(0x1702);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x304,"glMatrixMode(GL_TEXTURE)");
      glLoadMatrixf(local_58);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x305,"glLoadMatrixf(matrix)");
      glMatrixMode(0x1700);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x308,"glMatrixMode(GL_MODELVIEW)");
    }
  }
  GlResource::TransientContextLock::~TransientContextLock(&local_59);
  return extraout_EAX;
}

Assistant:

void Texture::bind(const Texture* texture, CoordinateType coordinateType)
{
    TransientContextLock lock;

    if (texture && texture->m_texture)
    {
        // Bind the texture
        glCheck(glBindTexture(GL_TEXTURE_2D, texture->m_texture));

        // Check if we need to define a special texture matrix
        if ((coordinateType == Pixels) || texture->m_pixelsFlipped)
        {
            GLfloat matrix[16] = {1.f, 0.f, 0.f, 0.f,
                                  0.f, 1.f, 0.f, 0.f,
                                  0.f, 0.f, 1.f, 0.f,
                                  0.f, 0.f, 0.f, 1.f};

            // If non-normalized coordinates (= pixels) are requested, we need to
            // setup scale factors that convert the range [0 .. size] to [0 .. 1]
            if (coordinateType == Pixels)
            {
                matrix[0] = 1.f / texture->m_actualSize.x;
                matrix[5] = 1.f / texture->m_actualSize.y;
            }

            // If pixels are flipped we must invert the Y axis
            if (texture->m_pixelsFlipped)
            {
                matrix[5] = -matrix[5];
                matrix[13] = static_cast<float>(texture->m_size.y) / texture->m_actualSize.y;
            }

            // Load the matrix
            glCheck(glMatrixMode(GL_TEXTURE));
            glCheck(glLoadMatrixf(matrix));

            // Go back to model-view mode (sf::RenderTarget relies on it)
            glCheck(glMatrixMode(GL_MODELVIEW));
        }
    }
    else
    {
        // Bind no texture
        glCheck(glBindTexture(GL_TEXTURE_2D, 0));

        // Reset the texture matrix
        glCheck(glMatrixMode(GL_TEXTURE));
        glCheck(glLoadIdentity());

        // Go back to model-view mode (sf::RenderTarget relies on it)
        glCheck(glMatrixMode(GL_MODELVIEW));
    }
}